

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifold_test.cpp
# Opt level: O2

Polygons * RotatePolygons(Polygons *__return_storage_ptr__,Polygons *polys,int index)

{
  pointer pvVar1;
  pointer __x;
  vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_> rotatedPolygon;
  _Vector_base<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_> local_40;
  
  (__return_storage_ptr__->
  super__Vector_base<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar1 = (polys->
           super__Vector_base<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (__x = (polys->
             super__Vector_base<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start; __x != pvVar1; __x = __x + 1) {
    std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>::vector
              ((vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_> *)&local_40
               ,__x);
    std::_V2::
    __rotate<__gnu_cxx::__normal_iterator<linalg::vec<double,2>*,std::vector<linalg::vec<double,2>,std::allocator<linalg::vec<double,2>>>>>
              (local_40._M_impl.super__Vector_impl_data._M_start,
               local_40._M_impl.super__Vector_impl_data._M_start + index,
               local_40._M_impl.super__Vector_impl_data._M_finish);
    std::
    vector<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)&local_40);
    std::_Vector_base<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>::
    ~_Vector_base(&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

Polygons RotatePolygons(Polygons polys, const int index) {
  Polygons rotatedPolys;
  for (auto& polygon : polys) {
    auto rotatedPolygon = polygon;
    std::rotate(rotatedPolygon.begin(), rotatedPolygon.begin() + index,
                rotatedPolygon.end());
    rotatedPolys.push_back(rotatedPolygon);
  }
  return rotatedPolys;
}